

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O2

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
treeEditDist(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
             *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2,int it1subtree,int it2subtree,
            Matrix<double> *forestdist,bool treesSwapped)

{
  long lVar1;
  size_t row;
  longlong *plVar2;
  size_t col;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer piVar12;
  int iVar13;
  double *pdVar14;
  long lVar15;
  int *piVar16;
  pointer piVar17;
  int *piVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  pointer piVar22;
  long lVar23;
  size_t sVar24;
  size_t col_00;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  uint uVar29;
  double dVar30;
  double dVar31;
  float fVar32;
  
  iVar6 = (t1->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[it1subtree];
  iVar7 = (t2->super_PreLToPostL).prel_to_postl_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[it2subtree];
  iVar8 = (t1->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[iVar6];
  lVar23 = (long)iVar8 + -1;
  iVar9 = (t2->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>._M_impl
          .super__Vector_impl_data._M_start[iVar7];
  pdVar14 = data_structures::Matrix<double>::at(forestdist,0,0);
  *pdVar14 = 0.0;
  uVar25 = iVar6 - (int)lVar23;
  uVar26 = (ulong)uVar25;
  if ((int)uVar25 < 1) {
    uVar26 = 0;
  }
  iVar13 = (int)uVar26;
  sVar24 = 1;
  while (bVar28 = uVar26 != 0, uVar26 = uVar26 - 1, bVar28) {
    pdVar14 = data_structures::Matrix<double>::read_at(forestdist,sVar24 - 1,0);
    dVar30 = *pdVar14;
    pdVar14 = data_structures::Matrix<double>::at(forestdist,sVar24,0);
    *pdVar14 = dVar30 + 1.0;
    sVar24 = sVar24 + 1;
  }
  lVar1 = (long)iVar9 + -1;
  uVar25 = iVar7 - (int)lVar1;
  if ((int)uVar25 < 1) {
    uVar25 = 0;
  }
  sVar24 = 1;
  uVar26 = (ulong)uVar25;
  while (bVar28 = uVar26 != 0, uVar26 = uVar26 - 1, bVar28) {
    pdVar14 = data_structures::Matrix<double>::read_at(forestdist,0,sVar24 - 1);
    dVar30 = *pdVar14;
    pdVar14 = data_structures::Matrix<double>::at(forestdist,0,sVar24);
    *pdVar14 = dVar30 + 1.0;
    sVar24 = sVar24 + 1;
  }
  for (sVar24 = 1; sVar24 != iVar13 + 1; sVar24 = sVar24 + 1) {
    lVar15 = lVar23 + sVar24;
    row = sVar24 - 1;
    col_00 = 0;
    lVar27 = lVar1 * 4;
    while (lVar27 = lVar27 + 4, uVar25 != col_00) {
      plVar2 = &(this->
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
                ).subproblem_counter_;
      *plVar2 = *plVar2 + 1;
      piVar16 = (t1->super_PostLToLabelId).postl_to_label_id_.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + lVar15;
      piVar18 = (int *)((long)(t2->super_PostLToLabelId).postl_to_label_id_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar27);
      piVar19 = piVar18;
      if (!treesSwapped) {
        piVar19 = piVar16;
        piVar16 = piVar18;
      }
      dVar30 = 0.0;
      if (*piVar19 != *piVar16) {
        dVar30 = 1.0;
      }
      col = col_00 + 1;
      pdVar14 = data_structures::Matrix<double>::read_at(forestdist,row,col);
      dVar3 = *pdVar14;
      pdVar14 = data_structures::Matrix<double>::read_at(forestdist,sVar24,col_00);
      dVar4 = *pdVar14;
      piVar17 = (t1->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar10 = piVar17[lVar15];
      piVar12 = (t2->super_PostLToLLD).postl_to_lld_.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((iVar10 == piVar17[iVar6]) && (piVar12[lVar1 + col_00 + 1] == piVar12[iVar7])) {
        pdVar14 = data_structures::Matrix<double>::read_at(forestdist,row,col_00);
        dVar31 = *pdVar14;
        pdVar14 = data_structures::Matrix<double>::read_at(forestdist,row,col_00);
        dVar5 = *pdVar14;
        if (treesSwapped) {
          iVar10 = (t2->super_PostLToPreL).postl_to_prel_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar1 + col_00 + 1];
          iVar11 = (t1->super_PostLToPreL).postl_to_prel_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar15];
        }
        else {
          iVar10 = (t1->super_PostLToPreL).postl_to_prel_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar15];
          iVar11 = (t2->super_PostLToPreL).postl_to_prel_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar1 + col_00 + 1];
        }
        pdVar14 = data_structures::Matrix<double>::at(&this->delta_,(long)iVar10,(long)iVar11);
        *pdVar14 = dVar5;
      }
      else {
        lVar21 = (long)iVar9 + col_00;
        pdVar14 = data_structures::Matrix<double>::read_at
                            (forestdist,(long)(iVar10 - iVar8),
                             (long)(piVar12[lVar1 + col_00 + 1] - iVar9));
        lVar20 = lVar15;
        if (treesSwapped) {
          lVar20 = lVar21;
        }
        dVar31 = *pdVar14;
        if (treesSwapped) {
          lVar21 = lVar15;
        }
        piVar17 = (t2->super_PostLToPreL).postl_to_prel_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar12 = (t1->super_PostLToPreL).postl_to_prel_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar22 = piVar12;
        if (treesSwapped) {
          piVar22 = piVar17;
        }
        if (treesSwapped) {
          piVar17 = piVar12;
        }
        pdVar14 = data_structures::Matrix<double>::read_at
                            (&this->delta_,(long)piVar22[lVar20],(long)piVar17[lVar21]);
        dVar31 = dVar31 + *pdVar14;
      }
      uVar29 = -(uint)((float)(dVar4 + 1.0) <= (float)(dVar3 + 1.0));
      fVar32 = (float)(~uVar29 & (uint)(float)(dVar3 + 1.0) | (uint)(float)(dVar4 + 1.0) & uVar29);
      uVar29 = -(uint)((float)(dVar30 + dVar31) <= fVar32);
      pdVar14 = data_structures::Matrix<double>::at(forestdist,sVar24,col);
      *pdVar14 = (double)(float)(uVar29 & (uint)(float)(dVar30 + dVar31) | ~uVar29 & (uint)fVar32);
      col_00 = col;
    }
  }
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::treeEditDist(const TreeIndex& t1,
    const TreeIndex& t2, int it1subtree, int it2subtree,
    data_structures::Matrix<double>& forestdist, bool treesSwapped) {
  // Translate input subtree root nodes to left-to-right postorder.
  int i = t1.prel_to_postl_[it1subtree];
  int j = t2.prel_to_postl_[it2subtree];
  // We need to offset the node ids for accessing forestdist array which has
  // indices from 0 to subtree size. However, the subtree node indices do not
  // necessarily start with 0.
  // Whenever the original left-to-right postorder id has to be accessed, use
  // i+ioff and j+joff.
  int ioff = t1.postl_to_lld_[i] - 1;
  int joff = t2.postl_to_lld_[j] - 1;
  // Variables holding costs of each minimum element.
  float da = 0;
  float db = 0;
  float dc = 0;
  // Initialize forestdist array with deletion and insertion costs of each
  // relevant subforest.
  forestdist.at(0, 0) = 0;
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    forestdist.at(i1, 0) = forestdist.read_at(i1 - 1, 0) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
  }
  for (int j1 = 1; j1 <= j - joff; ++j1) {
    forestdist.at(0, j1) = forestdist.read_at(0, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
  }
  // Fill in the remaining costs.
  for (int i1 = 1; i1 <= i - ioff; ++i1) {
    for (int j1 = 1; j1 <= j - joff; ++j1) {
      // Increment the number of subproblems.
      ++subproblem_counter_;
      // Calculate partial distance values for this subproblem.
      double u = (treesSwapped ? c_.ren(t2.postl_to_label_id_[j1 + joff], t1.postl_to_label_id_[i1 + ioff]) : c_.ren(t1.postl_to_label_id_[i1 + ioff], t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - rename i1 to j1.
      da = forestdist.read_at(i1 - 1, j1) + (treesSwapped ? c_.ins(t1.postl_to_label_id_[i1 + ioff]) : c_.del(t1.postl_to_label_id_[i1 + ioff])); // TODO: USE COST MODEL - delete i1.
      db = forestdist.read_at(i1, j1 - 1) + (treesSwapped ? c_.del(t2.postl_to_label_id_[j1 + joff]) : c_.ins(t2.postl_to_label_id_[j1 + joff])); // TODO: USE COST MODEL - insert j1.
      // If current subforests are subtrees.
      if (t1.postl_to_lld_[i1 + ioff] == t1.postl_to_lld_[i] && t2.postl_to_lld_[j1 + joff] == t2.postl_to_lld_[j]) {
        dc = forestdist.read_at(i1 - 1, j1 - 1) + u;
        // Store the relevant distance value in delta array.
        if (treesSwapped) {
          delta_.at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) = forestdist.read_at(i1 - 1, j1 - 1);
        } else {
          delta_.at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff]) = forestdist.read_at(i1 - 1, j1 - 1);
        }
      } else {
        dc = forestdist.read_at(t1.postl_to_lld_[i1 + ioff] - 1 - ioff, t2.postl_to_lld_[j1 + joff] - 1 - joff) +
          (treesSwapped ? delta_.read_at(t2.postl_to_prel_[j1 + joff], t1.postl_to_prel_[i1 + ioff]) : delta_.read_at(t1.postl_to_prel_[i1 + ioff], t2.postl_to_prel_[j1 + joff])) + u;
      }
      // Calculate final minimum.
      forestdist.at(i1, j1) = da >= db ? db >= dc ? dc : db : da >= dc ? dc : da;
    }
  }
}